

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cProgramInterfaceQueryTests.cpp
# Opt level: O0

void __thiscall
gl4cts::anon_unknown_0::PIQBase::VerifyGetProgramResourceLocationIndex
          (PIQBase *this,GLuint program,GLenum programInterface,string *name,GLint expected,
          long *error)

{
  uint uVar1;
  GLchar *name_00;
  undefined8 uVar2;
  GLint res;
  long *error_local;
  GLint expected_local;
  string *name_local;
  GLenum programInterface_local;
  GLuint program_local;
  PIQBase *this_local;
  
  name_00 = (GLchar *)std::__cxx11::string::c_str();
  uVar1 = glu::CallLogWrapper::glGetProgramResourceLocationIndex
                    (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,program,
                     programInterface,name_00);
  if (uVar1 != expected) {
    anon_unknown_0::Output("ERROR: Got %d, expected %d\n",(ulong)uVar1,(ulong)(uint)expected);
    uVar2 = std::__cxx11::string::c_str();
    anon_unknown_0::Output
              ("CALL: glGetProgramResourceLocationIndex, with %d, %s\n",(ulong)programInterface,
               uVar2);
    *error = -1;
  }
  return;
}

Assistant:

virtual inline void VerifyGetProgramResourceLocationIndex(GLuint program, GLenum programInterface,
															  const std::string& name, GLint expected, long& error)
	{
		GLint res = glGetProgramResourceLocationIndex(program, programInterface, name.c_str());
		if (res != expected)
		{
			Output("ERROR: Got %d, expected %d\n", res, expected);
			Output("CALL: glGetProgramResourceLocationIndex, with %d, %s\n", programInterface, name.c_str());
			error = ERROR;
		}
	}